

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::(anonymous_namespace)::
     sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
               (xpath_node *begin,xpath_node *end,document_order_comparator *pred)

{
  xml_attribute_struct *pxVar1;
  xpath_node *pxVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  undefined7 extraout_var;
  xpath_node *rhs;
  xpath_node *rhs_00;
  xpath_node *extraout_RDX;
  xpath_node *pxVar6;
  xpath_node *extraout_RDX_00;
  xpath_node *extraout_RDX_01;
  xpath_node *extraout_RDX_02;
  xpath_node *extraout_RDX_03;
  xpath_node *pxVar7;
  xpath_node *pxVar8;
  xpath_node *begin_00;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  xpath_node val;
  xml_node_struct *local_68;
  xml_attribute_struct *pxStack_60;
  xpath_node *local_58;
  xpath_node *local_50;
  xpath_node local_48;
  
  lVar5 = (long)end - (long)begin;
  while (0x10 < lVar5 >> 4) {
    pxVar6 = (xpath_node *)(&begin->_node + (lVar5 >> 4 & 0xfffffffffffffffe));
    local_50 = end;
    bVar3 = anon_unknown_0::document_order_comparator::operator()
                      ((document_order_comparator *)pxVar6,begin,(xpath_node *)pred);
    pxVar8 = pxVar6;
    pxVar7 = begin;
    if (bVar3) {
      pxVar8 = begin;
      pxVar7 = pxVar6;
    }
    bVar3 = anon_unknown_0::document_order_comparator::operator()
                      ((document_order_comparator *)(end + -1),pxVar8,rhs);
    if (bVar3) {
      pxVar8 = end + -1;
    }
    bVar3 = anon_unknown_0::document_order_comparator::operator()
                      ((document_order_comparator *)pxVar8,pxVar7,rhs_00);
    if (bVar3) {
      pxVar8 = pxVar7;
    }
    local_48._node._root = (pxVar8->_node)._root;
    local_48._attribute._attr = (pxVar8->_attribute)._attr;
    pxVar6 = extraout_RDX;
    pxVar7 = begin;
    pxVar8 = begin;
    begin_00 = end;
    local_58 = end;
    if (begin < end) {
      do {
        bVar3 = anon_unknown_0::document_order_comparator::operator()
                          ((document_order_comparator *)pxVar8,&local_48,pxVar6);
        if (bVar3) {
          pxVar8 = pxVar8 + 1;
        }
        else {
          auVar9._0_4_ = -(uint)(*(int *)&(pxVar8->_node)._root == (int)local_48._node._root);
          auVar9._4_4_ = -(uint)(*(int *)((long)&(pxVar8->_node)._root + 4) ==
                                local_48._node._root._4_4_);
          auVar9._8_4_ = -(uint)(*(int *)&(pxVar8->_attribute)._attr ==
                                (int)local_48._attribute._attr);
          auVar9._12_4_ =
               -(uint)(*(int *)((long)&(pxVar8->_attribute)._attr + 4) ==
                      local_48._attribute._attr._4_4_);
          auVar10._4_4_ = auVar9._0_4_;
          auVar10._0_4_ = auVar9._4_4_;
          auVar10._8_4_ = auVar9._12_4_;
          auVar10._12_4_ = auVar9._8_4_;
          iVar4 = movmskpd((int)CONCAT71(extraout_var,bVar3),auVar10 & auVar9);
          if (iVar4 == 3) {
            local_68 = (pxVar7->_node)._root;
            pxStack_60 = (pxVar7->_attribute)._attr;
            pxVar1 = (pxVar8->_attribute)._attr;
            (pxVar7->_node)._root = (pxVar8->_node)._root;
            (pxVar7->_attribute)._attr = pxVar1;
            pxVar7 = pxVar7 + 1;
            (pxVar8->_node)._root = local_68;
            (pxVar8->_attribute)._attr = pxStack_60;
            pxVar8 = pxVar8 + 1;
          }
          else {
            local_68 = (pxVar8->_node)._root;
            pxStack_60 = (pxVar8->_attribute)._attr;
            pxVar1 = begin_00[-1]._attribute._attr;
            (pxVar8->_node)._root = begin_00[-1]._node._root;
            (pxVar8->_attribute)._attr = pxVar1;
            begin_00[-1]._node._root = local_68;
            begin_00[-1]._attribute._attr = pxStack_60;
            begin_00 = begin_00 + -1;
          }
        }
        pxVar6 = extraout_RDX_00;
        end = begin_00;
        pxVar2 = begin;
      } while (pxVar8 < begin_00);
      for (; pxVar7 != pxVar2; pxVar2 = pxVar2 + 1) {
        local_68 = (pxVar2->_node)._root;
        pxStack_60 = (pxVar2->_attribute)._attr;
        pxVar1 = end[-1]._attribute._attr;
        (pxVar2->_node)._root = end[-1]._node._root;
        (pxVar2->_attribute)._attr = pxVar1;
        end[-1]._node._root = local_68;
        end[-1]._attribute._attr = pxStack_60;
        end = end + -1;
      }
    }
    if ((long)local_50 - (long)begin_00 < (long)end - (long)begin) {
      sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                (begin_00,local_58,(document_order_comparator *)pxVar6);
      pred = (document_order_comparator *)extraout_RDX_01;
      begin_00 = begin;
    }
    else {
      sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                (begin,end,(document_order_comparator *)pxVar6);
      pred = (document_order_comparator *)extraout_RDX_02;
      end = local_58;
    }
    begin = begin_00;
    lVar5 = (long)end - (long)begin_00;
  }
  pxVar6 = begin + 1;
  if (pxVar6 != end && begin != end) {
    do {
      local_68 = (pxVar6->_node)._root;
      pxStack_60 = (pxVar6->_attribute)._attr;
      pxVar7 = pxVar6;
      while (begin < pxVar7) {
        pxVar8 = pxVar7 + -1;
        bVar3 = anon_unknown_0::document_order_comparator::operator()
                          ((document_order_comparator *)&local_68,pxVar8,(xpath_node *)pred);
        pred = (document_order_comparator *)extraout_RDX_03;
        if (!bVar3) break;
        pxVar1 = pxVar7[-1]._attribute._attr;
        (pxVar7->_node)._root = (pxVar8->_node)._root;
        (pxVar7->_attribute)._attr = pxVar1;
        pxVar7 = pxVar8;
      }
      (pxVar7->_node)._root = local_68;
      (pxVar7->_attribute)._attr = pxStack_60;
      pxVar6 = pxVar6 + 1;
    } while (pxVar6 != end);
  }
  return;
}

Assistant:

PUGI_IMPL_FN void sort(I begin, I end, const Pred& pred)
	{
		// sort large chunks
		while (end - begin > 16)
		{
			// find median element
			I middle = begin + (end - begin) / 2;
			I median = median3(begin, middle, end - 1, pred);

			// partition in three chunks (< = >)
			I eqbeg, eqend;
			partition3(begin, end, *median, pred, &eqbeg, &eqend);

			// loop on larger half
			if (eqbeg - begin > end - eqend)
			{
				sort(eqend, end, pred);
				end = eqbeg;
			}
			else
			{
				sort(begin, eqbeg, pred);
				begin = eqend;
			}
		}

		// insertion sort small chunk
		insertion_sort(begin, end, pred);
	}